

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)&local_30,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_31);
  ByteData::ByteData(&this->seed_,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

HDWallet::HDWallet() : seed_(ByteData(kEmptySeedStr)) {
  // do nothing
}